

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack16_32(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  undefined6 uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [22];
  undefined1 auVar5 [30];
  undefined1 auVar6 [38];
  undefined1 auVar7 [46];
  undefined1 auVar8 [54];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined2 in_XMM4_Wa;
  undefined2 in_XMM4_We;
  undefined2 in_YMM4_H;
  undefined2 in_register_00001318;
  undefined2 in_register_00001320;
  undefined2 in_register_00001328;
  undefined2 in_register_00001330;
  undefined2 in_register_00001338;
  
  auVar9 = vpmovsxbd_avx512f(_DAT_00187c70);
  auVar10 = vpbroadcastq_avx512f(ZEXT816(0x100000ffff));
  auVar11 = vpermd_avx512f(auVar9,ZEXT3264(*(undefined1 (*) [32])in));
  auVar12 = vpblendmw_avx512bw(auVar11,ZEXT1664((undefined1  [16])0x0));
  auVar13._2_2_ = auVar12._2_2_;
  auVar13._0_2_ = in_XMM4_Wa;
  auVar13._10_2_ = auVar12._10_2_;
  auVar13._8_2_ = in_XMM4_We;
  auVar13._18_2_ = auVar12._18_2_;
  auVar13._16_2_ = in_YMM4_H;
  auVar13._26_2_ = auVar12._26_2_;
  auVar13._24_2_ = in_register_00001318;
  auVar13._34_2_ = auVar12._34_2_;
  auVar13._32_2_ = in_register_00001320;
  auVar13._42_2_ = auVar12._42_2_;
  auVar13._40_2_ = in_register_00001328;
  auVar13._50_2_ = auVar12._50_2_;
  auVar13._48_2_ = in_register_00001330;
  auVar13._58_2_ = auVar12._58_2_;
  auVar13._56_2_ = in_register_00001338;
  auVar11 = vpsrlvd_avx512f(auVar11,auVar10);
  auVar13._4_4_ = auVar11._4_4_;
  auVar13._12_4_ = auVar11._12_4_;
  auVar13._20_4_ = auVar11._20_4_;
  auVar13._28_4_ = auVar11._28_4_;
  auVar13._36_4_ = auVar11._36_4_;
  auVar13._44_4_ = auVar11._44_4_;
  auVar13._52_4_ = auVar11._52_4_;
  auVar13._60_4_ = auVar11._60_4_;
  auVar1 = *(undefined1 (*) [32])(in + 8);
  auVar11 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])out = auVar11;
  auVar11 = vpermd_avx512f(auVar9,ZEXT3264(auVar1));
  auVar12 = vpblendmw_avx512bw(auVar11,ZEXT1664((undefined1  [16])0x0));
  auVar14._2_2_ = auVar12._2_2_;
  auVar14._0_2_ = auVar9._0_2_;
  uVar2 = CONCAT24(auVar12._10_2_,auVar9._6_4_);
  auVar3._6_2_ = auVar9._12_2_;
  auVar3._0_6_ = uVar2;
  auVar3._8_2_ = auVar9._14_2_;
  auVar3._10_2_ = auVar9._16_2_;
  auVar3._12_2_ = auVar12._18_2_;
  auVar4._14_2_ = auVar9._20_2_;
  auVar4._0_14_ = auVar3;
  auVar4._16_2_ = auVar9._22_2_;
  auVar4._18_2_ = auVar9._24_2_;
  auVar4._20_2_ = auVar12._26_2_;
  auVar5._22_2_ = auVar9._28_2_;
  auVar5._0_22_ = auVar4;
  auVar5._24_2_ = auVar9._30_2_;
  auVar5._26_2_ = auVar9._32_2_;
  auVar5._28_2_ = auVar12._34_2_;
  auVar6._30_2_ = auVar9._36_2_;
  auVar6._0_30_ = auVar5;
  auVar6._32_2_ = auVar9._38_2_;
  auVar6._34_2_ = auVar9._40_2_;
  auVar6._36_2_ = auVar12._42_2_;
  auVar7._38_2_ = auVar9._44_2_;
  auVar7._0_38_ = auVar6;
  auVar7._40_2_ = auVar9._46_2_;
  auVar7._42_2_ = auVar9._48_2_;
  auVar7._44_2_ = auVar12._50_2_;
  auVar8._46_2_ = auVar9._52_2_;
  auVar8._0_46_ = auVar7;
  auVar8._48_2_ = auVar9._54_2_;
  auVar8._50_2_ = auVar9._56_2_;
  auVar8._52_2_ = auVar12._58_2_;
  auVar11 = vpsrlvd_avx512f(auVar11,auVar10);
  auVar14._4_4_ = auVar11._4_4_;
  auVar14._8_4_ = (int)((uint6)uVar2 >> 0x10);
  auVar14._12_4_ = auVar11._12_4_;
  auVar14._16_4_ = auVar3._10_4_;
  auVar14._20_4_ = auVar11._20_4_;
  auVar14._24_4_ = auVar4._18_4_;
  auVar14._28_4_ = auVar11._28_4_;
  auVar14._32_4_ = auVar5._26_4_;
  auVar14._36_4_ = auVar11._36_4_;
  auVar14._40_4_ = auVar6._34_4_;
  auVar14._44_4_ = auVar11._44_4_;
  auVar14._48_4_ = auVar7._42_4_;
  auVar14._52_4_ = auVar11._52_4_;
  auVar14._60_4_ = auVar11._60_4_;
  auVar14._56_4_ = auVar8._50_4_;
  auVar11 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])(out + 0x10) = auVar11;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack16_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  out++;

  return in;
}